

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_decompress_wksp_body_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  FSE_DTable *dt;
  ulong *srcBuffer;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  sbyte sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 *puVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  uint maxSymbolValue;
  uint tableLog;
  BIT_DStream_t bitD;
  FSE_DState_t state1;
  uint local_80;
  uint local_7c;
  BIT_DStream_t local_78;
  FSE_DState_t local_50;
  FSE_DState_t local_40;
  
  local_80 = 0xff;
  if (wkspSize < 0x204) {
    return 0xffffffffffffffff;
  }
  sVar5 = FSE_readNCount_body_bmi2((short *)workSpace,&local_80,&local_7c,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (maxLog < local_7c) {
    return 0xffffffffffffffd4;
  }
  lVar12 = (long)(1 << (local_7c & 0x1f));
  if (wkspSize <
      ((1L << ((ulong)local_7c & 0x3f)) + (ulong)(local_80 + 1) * 2 + lVar12 * 4 + 0x13 &
      0xfffffffffffffffc) + 0x204) {
    return 0xffffffffffffffd4;
  }
  dt = (FSE_DTable *)((long)workSpace + 0x200);
  sVar6 = FSE_buildDTable_internal
                    (dt,(short *)workSpace,local_80,local_7c,
                     (void *)(lVar12 * 4 + 0x208 + (long)workSpace),
                     (wkspSize - (lVar12 * 4 + 4)) - 0x204);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  srcBuffer = (ulong *)((long)cSrc + sVar5);
  sVar5 = cSrcSize - sVar5;
  puVar13 = (undefined1 *)((long)dst + (dstCapacity - 3));
  if (*(short *)((long)workSpace + 0x202) == 0) {
    sVar5 = BIT_initDStream(&local_78,srcBuffer,sVar5);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    FSE_initDState(&local_40,&local_78,dt);
    FSE_initDState(&local_50,&local_78,dt);
    iVar14 = (int)local_78.start;
    puVar9 = (undefined1 *)dst;
    puVar8 = (undefined1 *)dst;
    if (local_78.bitsConsumed < 0x41) {
      do {
        puVar9 = puVar8;
        if (local_78.ptr < local_78.limitPtr) {
          if (local_78.ptr == local_78.start) break;
          bVar21 = local_78.start <=
                   (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3));
          uVar18 = (int)local_78.ptr - iVar14;
          if (bVar21) {
            uVar18 = local_78.bitsConsumed >> 3;
          }
          local_78.bitsConsumed = local_78.bitsConsumed + uVar18 * -8;
        }
        else {
          uVar18 = local_78.bitsConsumed >> 3;
          local_78.bitsConsumed = local_78.bitsConsumed & 7;
          bVar21 = true;
        }
        local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar18);
        local_78.bitContainer = *(size_t *)local_78.ptr;
        if ((puVar13 <= puVar8) || (!bVar21)) break;
        uVar11 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
        bVar2 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
        sVar4 = (bVar2 < 0x41) * ('@' - bVar2);
        uVar19 = ((local_78.bitContainer >>
                  ((ulong)(byte)-(char)(local_78.bitsConsumed + bVar2) & 0x3f)) << sVar4) >> sVar4;
        *puVar8 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
        uVar20 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
        bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
        iVar15 = local_78.bitsConsumed + bVar2 + (uint)bVar1;
        sVar4 = (bVar1 < 0x41) * ('@' - bVar1);
        uVar10 = ((local_78.bitContainer >> ((ulong)(byte)-(char)iVar15 & 0x3f)) << sVar4) >> sVar4;
        puVar8[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
        bVar2 = *(byte *)((long)local_40.table + uVar11 * 4 + uVar19 * 4 + 3);
        iVar15 = iVar15 + (uint)bVar2;
        sVar4 = (bVar2 < 0x41) * ('@' - bVar2);
        local_40.state =
             (((local_78.bitContainer >> ((ulong)(byte)-(char)iVar15 & 0x3f)) << sVar4) >> sVar4) +
             (ulong)*(ushort *)((long)local_40.table + uVar11 * 4 + uVar19 * 4);
        puVar8[2] = *(undefined1 *)((long)local_40.table + uVar11 * 4 + uVar19 * 4 + 2);
        bVar2 = *(byte *)((long)local_50.table + uVar20 * 4 + uVar10 * 4 + 3);
        local_78.bitsConsumed = iVar15 + (uint)bVar2;
        sVar4 = (bVar2 < 0x41) * ('@' - bVar2);
        local_50.state =
             (((local_78.bitContainer >> ((ulong)(byte)-(char)local_78.bitsConsumed & 0x3f)) <<
              sVar4) >> sVar4) + (ulong)*(ushort *)((long)local_50.table + uVar20 * 4 + uVar10 * 4);
        puVar8[3] = *(undefined1 *)((long)local_50.table + uVar20 * 4 + uVar10 * 4 + 2);
        puVar9 = puVar8 + 4;
        puVar8 = puVar8 + 4;
        if (0x40 < local_78.bitsConsumed) break;
      } while( true );
    }
    puVar13 = (undefined1 *)((long)dst + (dstCapacity - 2));
    if (puVar13 < puVar9) {
      return 0xffffffffffffffba;
    }
    lVar12 = (long)puVar9 - (long)dst;
    puVar9 = puVar9 + 1;
    while( true ) {
      uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
      bVar2 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
      local_78.bitsConsumed = local_78.bitsConsumed + bVar2;
      puVar9[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
      if (0x40 < local_78.bitsConsumed) break;
      if (local_78.ptr < local_78.limitPtr) {
        uVar20 = local_78.bitContainer;
        uVar18 = local_78.bitsConsumed;
        if (local_78.ptr != local_78.start) {
          uVar20 = (ulong)(uint)((int)local_78.ptr - iVar14);
          if (local_78.start <= (ulong *)((long)local_78.ptr - (ulong)(local_78.bitsConsumed >> 3)))
          {
            uVar20 = (ulong)(local_78.bitsConsumed >> 3);
          }
          uVar18 = local_78.bitsConsumed + (int)uVar20 * -8;
          goto LAB_0013e05b;
        }
      }
      else {
        uVar20 = (ulong)(local_78.bitsConsumed >> 3);
        uVar18 = local_78.bitsConsumed & 7;
LAB_0013e05b:
        local_78.ptr = (char *)((long)local_78.ptr - uVar20);
        uVar20 = *(ulong *)local_78.ptr;
      }
      if (puVar13 < puVar9) {
        return 0xffffffffffffffba;
      }
      sVar4 = (bVar2 < 0x41) * ('@' - bVar2);
      local_40.state =
           (((local_78.bitContainer >> ((ulong)(byte)-(char)local_78.bitsConsumed & 0x3f)) << sVar4)
           >> sVar4) + (ulong)uVar3;
      uVar3 = *(ushort *)((long)local_50.table + local_50.state * 4);
      bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
      uVar18 = uVar18 + bVar2;
      *puVar9 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
      if (0x40 < uVar18) goto LAB_0013e4a9;
      if (local_78.ptr < local_78.limitPtr) {
        local_78.bitContainer = uVar20;
        local_78.bitsConsumed = uVar18;
        if (local_78.ptr != local_78.start) {
          uVar16 = (int)local_78.ptr - iVar14;
          if (local_78.start <= (ulong *)((long)local_78.ptr - (ulong)(uVar18 >> 3))) {
            uVar16 = uVar18 >> 3;
          }
          local_78.bitsConsumed = uVar18 + uVar16 * -8;
          goto LAB_0013e0e0;
        }
      }
      else {
        uVar16 = uVar18 >> 3;
        local_78.bitsConsumed = uVar18 & 7;
LAB_0013e0e0:
        local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar16);
        local_78.bitContainer = *(ulong *)local_78.ptr;
      }
      sVar4 = (bVar2 < 0x41) * ('@' - bVar2);
      local_50.state =
           (((uVar20 >> ((ulong)(byte)-(char)uVar18 & 0x3f)) << sVar4) >> sVar4) + (ulong)uVar3;
      lVar12 = lVar12 + 2;
      puVar8 = puVar9 + 1;
      puVar9 = puVar9 + 2;
      if (puVar13 < puVar8) {
        return 0xffffffffffffffba;
      }
    }
  }
  else {
    if (sVar5 == 0) {
      return 0xffffffffffffffb8;
    }
    local_78.limitPtr = (char *)(srcBuffer + 1);
    if (sVar5 < 8) {
      local_78.bitContainer = (size_t)(byte)*srcBuffer;
      switch(sVar5) {
      case 2:
        goto LAB_0013e169;
      case 3:
        goto LAB_0013e15f;
      case 4:
        break;
      case 7:
        local_78.bitContainer =
             local_78.bitContainer | (ulong)*(byte *)((long)srcBuffer + 6) << 0x30;
      case 6:
        local_78.bitContainer =
             local_78.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
      case 5:
        local_78.bitContainer =
             local_78.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
        break;
      default:
        goto switchD_0013de95_default;
      }
      local_78.bitContainer =
           local_78.bitContainer + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
LAB_0013e15f:
      local_78.bitContainer =
           local_78.bitContainer + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
LAB_0013e169:
      local_78.bitContainer = (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + local_78.bitContainer;
switchD_0013de95_default:
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar2 == 0) {
        return 0xffffffffffffffec;
      }
      local_78.bitsConsumed = LZCOUNT((uint)bVar2) + (int)sVar5 * -8 + 0x29;
      local_78.ptr = (char *)srcBuffer;
    }
    else {
      local_78.ptr = (char *)((long)cSrc + (cSrcSize - 8));
      local_78.bitContainer = *(size_t *)local_78.ptr;
      if (local_78.bitContainer >> 0x38 == 0) {
        return 0xffffffffffffffff;
      }
      local_78.bitsConsumed =
           (LZCOUNT((uint)(byte)(local_78.bitContainer >> 0x38)) ^ 0xffffffe0U) + 9;
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
    }
    local_78.start = (char *)srcBuffer;
    FSE_initDState(&local_40,&local_78,dt);
    FSE_initDState(&local_50,&local_78,dt);
    uVar20 = (ulong)local_78.bitsConsumed;
    iVar14 = (int)local_78.start;
    puVar9 = (undefined1 *)dst;
    puVar8 = (undefined1 *)dst;
    if (local_78.bitsConsumed < 0x41) {
      do {
        puVar9 = puVar8;
        if (local_78.ptr < local_78.limitPtr) {
          if (local_78.ptr == local_78.start) break;
          bVar21 = local_78.start <= (ulong *)((long)local_78.ptr - (uVar20 >> 3));
          uVar18 = (int)local_78.ptr - iVar14;
          if (bVar21) {
            uVar18 = (uint)(uVar20 >> 3);
          }
          uVar16 = (uint)uVar20 + uVar18 * -8;
        }
        else {
          uVar18 = (uint)(uVar20 >> 3);
          uVar16 = (uint)uVar20 & 7;
          bVar21 = true;
        }
        uVar20 = (ulong)uVar16;
        local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar18);
        local_78.bitContainer = *(size_t *)local_78.ptr;
        if ((puVar13 <= puVar8) || (!bVar21)) break;
        uVar19 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
        bVar2 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
        uVar16 = uVar16 + bVar2;
        uVar20 = (local_78.bitContainer << (uVar20 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f);
        *puVar8 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
        uVar10 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
        bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
        uVar18 = uVar16 + bVar2;
        uVar11 = (local_78.bitContainer << ((ulong)uVar16 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f);
        puVar8[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
        bVar2 = *(byte *)((long)local_40.table + uVar19 * 4 + uVar20 * 4 + 3);
        uVar16 = uVar18 + bVar2;
        local_40.state =
             ((local_78.bitContainer << ((ulong)uVar18 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)) +
             (ulong)*(ushort *)((long)local_40.table + uVar19 * 4 + uVar20 * 4);
        puVar8[2] = *(undefined1 *)((long)local_40.table + uVar19 * 4 + uVar20 * 4 + 2);
        bVar2 = *(byte *)((long)local_50.table + uVar10 * 4 + uVar11 * 4 + 3);
        uVar18 = uVar16 + bVar2;
        uVar20 = (ulong)uVar18;
        local_50.state =
             ((local_78.bitContainer << ((ulong)uVar16 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)) +
             (ulong)*(ushort *)((long)local_50.table + uVar10 * 4 + uVar11 * 4);
        puVar8[3] = *(undefined1 *)((long)local_50.table + uVar10 * 4 + uVar11 * 4 + 2);
        puVar9 = puVar8 + 4;
        puVar8 = puVar8 + 4;
        if (0x40 < uVar18) break;
      } while( true );
    }
    puVar13 = (undefined1 *)((long)dst + (dstCapacity - 2));
    if (puVar13 < puVar9) {
      return 0xffffffffffffffba;
    }
    lVar12 = (long)puVar9 - (long)dst;
    puVar9 = puVar9 + 1;
    while( true ) {
      uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
      bVar2 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
      uVar18 = (int)uVar20 + (uint)bVar2;
      puVar9[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
      if (0x40 < uVar18) break;
      if (local_78.ptr < local_78.limitPtr) {
        uVar10 = local_78.bitContainer;
        if (local_78.ptr != local_78.start) {
          uVar16 = (int)local_78.ptr - iVar14;
          if (local_78.start <= (ulong *)((long)local_78.ptr - (ulong)(uVar18 >> 3))) {
            uVar16 = uVar18 >> 3;
          }
          uVar18 = uVar18 + uVar16 * -8;
          goto LAB_0013e3c2;
        }
      }
      else {
        uVar16 = uVar18 >> 3;
        uVar18 = uVar18 & 7;
LAB_0013e3c2:
        local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar16);
        uVar10 = *(ulong *)local_78.ptr;
      }
      if (puVar13 < puVar9) {
        return 0xffffffffffffffba;
      }
      local_40.state =
           ((local_78.bitContainer << (uVar20 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)) +
           (ulong)uVar3;
      uVar3 = *(ushort *)((long)local_50.table + local_50.state * 4);
      bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
      uVar16 = uVar18 + bVar2;
      *puVar9 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
      if (0x40 < uVar16) goto LAB_0013e4a9;
      if (local_78.ptr < local_78.limitPtr) {
        local_78.bitContainer = uVar10;
        if (local_78.ptr != local_78.start) {
          uVar17 = (int)local_78.ptr - iVar14;
          if (local_78.start <= (ulong *)((long)local_78.ptr - (ulong)(uVar16 >> 3))) {
            uVar17 = uVar16 >> 3;
          }
          uVar16 = uVar16 + uVar17 * -8;
          goto LAB_0013e44b;
        }
      }
      else {
        uVar17 = uVar16 >> 3;
        uVar16 = uVar16 & 7;
LAB_0013e44b:
        local_78.ptr = (char *)((long)local_78.ptr - (ulong)uVar17);
        local_78.bitContainer = *(ulong *)local_78.ptr;
      }
      uVar20 = (ulong)uVar16;
      local_50.state =
           ((uVar10 << ((ulong)uVar18 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)) + (ulong)uVar3;
      lVar12 = lVar12 + 2;
      puVar8 = puVar9 + 1;
      puVar9 = puVar9 + 2;
      if (puVar13 < puVar8) {
        return 0xffffffffffffffba;
      }
    }
  }
  local_40.table = (void *)((long)local_50.table + local_50.state * 4);
  lVar7 = 2;
LAB_0013e4b9:
  *puVar9 = *(undefined1 *)((long)local_40.table + 2);
  return lVar7 + lVar12;
LAB_0013e4a9:
  local_40.table = (void *)((long)local_40.table + local_40.state * 4);
  puVar9 = puVar9 + 1;
  lVar7 = 3;
  goto LAB_0013e4b9;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_decompress_wksp_body_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 1);
}